

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

int fitsInsideBoundaries(Point32 *coord32,TerritoryBoundary *b)

{
  int iVar1;
  bool local_19;
  TerritoryBoundary *b_local;
  Point32 *coord32_local;
  
  local_19 = false;
  if ((b->miny <= coord32->latMicroDeg) && (local_19 = false, coord32->latMicroDeg < b->maxy)) {
    iVar1 = isInRange(coord32->lonMicroDeg,b->minx,b->maxx);
    local_19 = iVar1 != 0;
  }
  return (int)local_19;
}

Assistant:

static int fitsInsideBoundaries(const Point32 *coord32, const TerritoryBoundary *b) {
    ASSERT(coord32);
    ASSERT(b);
    return (b->miny <= coord32->latMicroDeg &&
            coord32->latMicroDeg < b->maxy &&
            isInRange(coord32->lonMicroDeg, b->minx, b->maxx));
}